

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

void * RPLIDARExpressScanThread(void *pParam)

{
  _Map_pointer ppdVar1;
  uint uVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  _Map_pointer *__args;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  CRITICAL_SECTION *__mutex;
  uint uVar15;
  long lVar16;
  long lVar17;
  BOOL bNewScan;
  double angles [32];
  double distances [32];
  uint local_280;
  BOOL local_27c;
  deque<double,std::allocator<double>> *local_278;
  deque<double,std::allocator<double>> *local_270;
  uint local_268;
  uint local_264;
  ulong local_260;
  void *local_258;
  void *local_250;
  long local_248;
  CRITICAL_SECTION *local_240;
  _Deque_base<double,_std::allocator<double>_> local_238 [3];
  double local_138 [33];
  
  local_27c = 0;
  __mutex = RPLIDARCS;
  lVar7 = 0;
  lVar16 = 0;
  lVar17 = 0;
  while (*(void **)((long)addrsRPLIDAR + lVar7 * 2) != pParam) {
    __mutex = __mutex + 1;
    lVar17 = lVar17 + 0x50;
    lVar16 = lVar16 + 0x10000;
    lVar7 = lVar7 + 4;
    if (lVar17 == 0x500) {
      return (void *)0x0;
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_260 = 0;
  std::_Deque_base<double,_std::allocator<double>_>::_M_initialize_map(local_238,0);
  local_270 = (deque<double,std::allocator<double>> *)
              ((long)&anglesvectorRPLIDAR[0].super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_map + lVar17);
  std::deque<double,_std::allocator<double>_>::_M_move_assign1();
  std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(local_238);
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<double,_std::allocator<double>_>::_M_initialize_map(local_238,0);
  local_278 = (deque<double,std::allocator<double>> *)
              ((long)&distancesvectorRPLIDAR[0].super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_map + lVar17);
  std::deque<double,_std::allocator<double>_>::_M_move_assign1();
  std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(local_238);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  local_258 = (void *)((long)distancesRPLIDAR[0] + lVar16);
  local_250 = (void *)((long)anglesRPLIDAR[0] + lVar16);
  uVar15 = 0;
  local_280 = 0;
  local_248 = lVar7;
  local_240 = __mutex;
  do {
    memset(local_138,0,0x100);
    memset(local_238,0,0x100);
    local_268 = GetExpressScanDataResponseRPLIDAR
                          ((RPLIDAR *)pParam,local_138,(double *)local_238,&local_27c);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    memcpy(local_258,local_138,0x100);
    memcpy(local_250,local_238,0x100);
    *(BOOL *)((long)bNewScanRPLIDAR + lVar7) = local_27c;
    lVar16 = 0;
    do {
      puVar3 = *(undefined8 **)
                ((long)&anglesvectorRPLIDAR[0].super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_cur + lVar17);
      uVar2 = local_280;
      uVar14 = uVar15;
      if (*(int *)((long)pParam + 0x6c8) == 0) {
        lVar7 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                 super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                 super__Deque_impl_data._M_finish._M_node + lVar17);
        lVar4 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                 super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                 super__Deque_impl_data._M_start._M_node + lVar17);
        lVar10 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                  super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                  super__Deque_impl_data._M_start._M_cur + lVar17);
        lVar7 = (*(long *)((long)&anglesvectorRPLIDAR[0].
                                  super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                  super__Deque_impl_data._M_start._M_last + lVar17) - lVar10 >> 3) +
                ((long)puVar3 -
                 *(long *)((long)&anglesvectorRPLIDAR[0].
                                  super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                  super__Deque_impl_data._M_finish._M_first + lVar17) >> 3) +
                ((((ulong)(lVar7 - lVar4) >> 3) - 1) + (ulong)(lVar7 == 0)) * 0x40;
        if (4 < (int)lVar7) {
          lVar7 = lVar7 << 0x20;
          lVar13 = lVar7 + -0x500000000 >> 0x20;
          lVar5 = lVar10 - *(long *)((long)&anglesvectorRPLIDAR[0].
                                            super__Deque_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Deque_impl_data._M_start._M_first +
                                    lVar17) >> 3;
          uVar12 = lVar5 + lVar13;
          if ((long)uVar12 < 0) {
            uVar9 = (long)uVar12 >> 6;
LAB_0010e0e9:
            pdVar6 = (double *)((uVar12 + uVar9 * -0x40) * 8 + *(long *)(lVar4 + uVar9 * 8));
          }
          else {
            if (0x3f < uVar12) {
              uVar9 = uVar12 >> 6;
              goto LAB_0010e0e9;
            }
            pdVar6 = (double *)(lVar10 + lVar13 * 8);
          }
          ppdVar1 = (&local_238[0]._M_impl.super__Deque_impl_data._M_map)[lVar16];
          if (3.141592653589793 < (double)ppdVar1 - *pdVar6) {
            lVar13 = lVar7 + -0x400000000 >> 0x20;
            uVar12 = lVar5 + lVar13;
            if ((long)uVar12 < 0) {
              uVar9 = (long)uVar12 >> 6;
LAB_0010e14e:
              pdVar6 = (double *)((uVar12 + uVar9 * -0x40) * 8 + *(long *)(lVar4 + uVar9 * 8));
            }
            else {
              if (0x3f < uVar12) {
                uVar9 = uVar12 >> 6;
                goto LAB_0010e14e;
              }
              pdVar6 = (double *)(lVar10 + lVar13 * 8);
            }
            if (3.141592653589793 < (double)ppdVar1 - *pdVar6) {
              lVar13 = lVar7 + -0x300000000 >> 0x20;
              uVar12 = lVar5 + lVar13;
              if ((long)uVar12 < 0) {
                uVar9 = (long)uVar12 >> 6;
LAB_0010e1ad:
                pdVar6 = (double *)((uVar12 + uVar9 * -0x40) * 8 + *(long *)(lVar4 + uVar9 * 8));
              }
              else {
                if (0x3f < uVar12) {
                  uVar9 = uVar12 >> 6;
                  goto LAB_0010e1ad;
                }
                pdVar6 = (double *)(lVar10 + lVar13 * 8);
              }
              if (3.141592653589793 < (double)ppdVar1 - *pdVar6) {
                lVar13 = lVar7 + -0x200000000 >> 0x20;
                uVar12 = lVar5 + lVar13;
                if ((long)uVar12 < 0) {
                  uVar9 = (long)uVar12 >> 6;
LAB_0010e20c:
                  pdVar6 = (double *)((uVar12 + uVar9 * -0x40) * 8 + *(long *)(lVar4 + uVar9 * 8));
                }
                else {
                  if (0x3f < uVar12) {
                    uVar9 = uVar12 >> 6;
                    goto LAB_0010e20c;
                  }
                  pdVar6 = (double *)(lVar10 + lVar13 * 8);
                }
                if (3.141592653589793 < (double)ppdVar1 - *pdVar6) {
                  lVar7 = lVar7 + -0x100000000 >> 0x20;
                  uVar12 = lVar5 + lVar7;
                  if ((long)uVar12 < 0) {
                    uVar9 = (long)uVar12 >> 6;
LAB_0010e267:
                    pdVar6 = (double *)((uVar12 + uVar9 * -0x40) * 8 + *(long *)(lVar4 + uVar9 * 8))
                    ;
                  }
                  else {
                    if (0x3f < uVar12) {
                      uVar9 = uVar12 >> 6;
                      goto LAB_0010e267;
                    }
                    pdVar6 = (double *)(lVar10 + lVar7 * 8);
                  }
                  if ((3.141592653589793 < (double)ppdVar1 - *pdVar6) &&
                     (uVar14 = 0, uVar2 = uVar15, -1 < (int)(~uVar15 + local_280))) {
                    iVar8 = local_280 - uVar15;
                    local_264 = uVar15;
                    do {
                      lVar7 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                               super__Deque_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Deque_impl_data._M_finish._M_node +
                                       lVar17);
                      if (0 < (int)((int)((ulong)(*(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                                      
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_last +
                                                  lVar17) -
                                                 *(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                                    
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur +
                                                  lVar17)) >> 3) +
                                    (int)((ulong)(*(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                                      
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur +
                                                  lVar17) -
                                                 *(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                                    
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_first
                                                  + lVar17)) >> 3) +
                                   ((((uint)((int)lVar7 -
                                            *(int *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                        
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  lVar17)) >> 3) - 1) + (uint)(lVar7 == 0)) * 0x40))
                      {
                        std::deque<double,_std::allocator<double>_>::pop_front
                                  ((deque<double,_std::allocator<double>_> *)local_270);
                        std::deque<double,_std::allocator<double>_>::pop_front
                                  ((deque<double,_std::allocator<double>_> *)local_278);
                        uVar15 = local_264;
                      }
                      iVar8 = iVar8 + -1;
                    } while (0 < iVar8);
                    puVar3 = *(undefined8 **)
                              ((long)&anglesvectorRPLIDAR[0].
                                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                      super__Deque_impl_data._M_finish._M_cur + lVar17);
                    uVar2 = uVar15;
                  }
                }
              }
            }
          }
        }
      }
      local_280 = uVar2;
      __args = &local_238[0]._M_impl.super__Deque_impl_data._M_map + lVar16;
      if (puVar3 == (undefined8 *)
                    (*(long *)((long)&anglesvectorRPLIDAR[0].
                                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                      super__Deque_impl_data._M_finish._M_last + lVar17) + -8)) {
        std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                  (local_270,(double *)__args);
      }
      else {
        *puVar3 = *__args;
        *(undefined8 **)
         ((long)&anglesvectorRPLIDAR[0].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur + lVar17) = puVar3 + 1;
      }
      pdVar6 = *(double **)
                ((long)&distancesvectorRPLIDAR[0].super__Deque_base<double,_std::allocator<double>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur + lVar17);
      if (pdVar6 == (double *)
                    (*(long *)((long)&distancesvectorRPLIDAR[0].
                                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                      super__Deque_impl_data._M_finish._M_last + lVar17) + -8)) {
        std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                  (local_278,local_138 + lVar16);
      }
      else {
        *pdVar6 = local_138[lVar16];
        *(double **)
         ((long)&distancesvectorRPLIDAR[0].super__Deque_base<double,_std::allocator<double>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur + lVar17) = pdVar6 + 1;
      }
      iVar8 = *(int *)((long)pParam + 0x6c8);
      lVar7 = *(long *)((long)&anglesvectorRPLIDAR[0].
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_node + lVar17);
      iVar11 = (int)*(undefined8 *)
                     ((long)&anglesvectorRPLIDAR[0].
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_start._M_node + lVar17);
      lVar4 = *(long *)((long)&anglesvectorRPLIDAR[0].
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_cur + lVar17);
      lVar10 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_first + lVar17);
      lVar5 = *(long *)((long)&anglesvectorRPLIDAR[0].
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_cur + lVar17);
      lVar13 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                super__Deque_impl_data._M_start._M_last + lVar17);
      uVar15 = uVar14;
      if (iVar8 == 0) {
        uVar15 = uVar14 + 1;
        if (((int)uVar14 < (int)local_280) &&
           (0 < (int)((int)((ulong)(lVar13 - lVar5) >> 3) + (int)((ulong)(lVar4 - lVar10) >> 3) +
                     ((((uint)((int)lVar7 - iVar11) >> 3) - 1) + (uint)(lVar7 == 0)) * 0x40))) {
          std::deque<double,_std::allocator<double>_>::pop_front
                    ((deque<double,_std::allocator<double>_> *)local_270);
          std::deque<double,_std::allocator<double>_>::pop_front
                    ((deque<double,_std::allocator<double>_> *)local_278);
          iVar8 = *(int *)((long)pParam + 0x6c8);
          lVar7 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                   super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                   super__Deque_impl_data._M_finish._M_node + lVar17);
          iVar11 = (int)*(undefined8 *)
                         ((long)&anglesvectorRPLIDAR[0].
                                 super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                 super__Deque_impl_data._M_start._M_node + lVar17);
          lVar4 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                   super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                   super__Deque_impl_data._M_finish._M_cur + lVar17);
          lVar10 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                    super__Deque_impl_data._M_finish._M_first + lVar17);
          lVar5 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                   super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                   super__Deque_impl_data._M_start._M_cur + lVar17);
          lVar13 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                    super__Deque_impl_data._M_start._M_last + lVar17);
          goto LAB_0010e3bc;
        }
LAB_0010e482:
        if (0x2000 < (int)((int)((ulong)(lVar13 - lVar5) >> 3) + (int)((ulong)(lVar4 - lVar10) >> 3)
                          + ((((uint)((int)lVar7 - iVar11) >> 3) - 1) + (uint)(lVar7 == 0)) * 0x40))
        goto LAB_0010e4b3;
      }
      else {
LAB_0010e3bc:
        if ((iVar8 < 1) ||
           ((int)((int)((ulong)(lVar13 - lVar5) >> 3) + (int)((ulong)(lVar4 - lVar10) >> 3) +
                 ((((uint)((int)lVar7 - iVar11) >> 3) - 1) + (uint)(lVar7 == 0)) * 0x40) <= iVar8))
        goto LAB_0010e482;
LAB_0010e4b3:
        std::deque<double,_std::allocator<double>_>::pop_front
                  ((deque<double,_std::allocator<double>_> *)local_270);
        std::deque<double,_std::allocator<double>_>::pop_front
                  ((deque<double,_std::allocator<double>_> *)local_278);
      }
      __mutex = local_240;
      lVar7 = local_248;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x20);
    local_260 = local_260 & 0xffffffff;
    if (local_268 != 0) {
      local_260 = (ulong)local_268;
    }
    *(int *)((long)resRPLIDAR + local_248) = (int)local_260;
    pthread_mutex_unlock((pthread_mutex_t *)local_240);
    if (*(int *)((long)bExitExpressScanRPLIDAR + lVar7) != 0) {
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE RPLIDARExpressScanThread(void* pParam)
{
	RPLIDAR* pRPLIDAR = (RPLIDAR*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	double angles[NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR];
	double distances[NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR];
	BOOL bNewScan = FALSE, bAutoNewScan = FALSE;
	int i = 0, j = 0, nb = 0, nbprev = 0;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

#ifdef __cplusplus
	EnterCriticalSection(&RPLIDARCS[id]);
	anglesvectorRPLIDAR[id] = std::deque<double>();
	distancesvectorRPLIDAR[id] = std::deque<double>();
	LeaveCriticalSection(&RPLIDARCS[id]);
#endif // __cplusplus

	for (;;)
	{
		//mSleep(pRPLIDAR->threadperiod);
		memset(distances, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
		memset(angles, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
		res = GetExpressScanDataResponseRPLIDAR(pRPLIDAR, distances, angles, &bNewScan);
		if (res != EXIT_SUCCESS) err = res;
		//if (GetExpressScanDataResponseRPLIDAR(pRPLIDAR, distances, angles, &bNewScan) == EXIT_SUCCESS)
		{
			EnterCriticalSection(&RPLIDARCS[id]);
			memcpy(distancesRPLIDAR[id], distances, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
			memcpy(anglesRPLIDAR[id], angles, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
			bNewScanRPLIDAR[id] = bNewScan;

#ifdef __cplusplus
			for (i = 0; i < NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; i++)
			{
				if (pRPLIDAR->maxhist == 0)
				{
					// Try to detect the beginning of a new scan with the angle discontinuity...
					// Try to be a little bit robust w.r.t. non-decreasing outliers...
					if (((int)anglesvectorRPLIDAR[id].size() >= 5)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-5]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-4]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-3]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-2]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-1]) > M_PI))
						bAutoNewScan = TRUE; else bAutoNewScan = FALSE;
					if (bAutoNewScan)
					{
						// Try to automatically remove old data...
						for (j = nbprev-nb-1; j >= 0; j--)
						{
							if ((int)anglesvectorRPLIDAR[id].size() > 0)
							{
								anglesvectorRPLIDAR[id].pop_front();
								distancesvectorRPLIDAR[id].pop_front();
							}
						}
						nbprev = nb;
						nb = 0;
					}
				}

				anglesvectorRPLIDAR[id].push_back(angles[i]);
				distancesvectorRPLIDAR[id].push_back(distances[i]);

				if (pRPLIDAR->maxhist == 0)
				{
					// Try to automatically remove old data...
					nb++;
					if ((nb <= nbprev)&&((int)anglesvectorRPLIDAR[id].size() > 0))
					{
						anglesvectorRPLIDAR[id].pop_front();
						distancesvectorRPLIDAR[id].pop_front();
					}
				}
				if (((pRPLIDAR->maxhist > 0)&&((int)anglesvectorRPLIDAR[id].size() > pRPLIDAR->maxhist))||
					((int)anglesvectorRPLIDAR[id].size() > MAX_NB_MEASUREMENTS_PER_SCAN_RPLIDAR))
				{
					anglesvectorRPLIDAR[id].pop_front();
					distancesvectorRPLIDAR[id].pop_front();
				}
			}
#endif // __cplusplus

			resRPLIDAR[id] = err;
			LeaveCriticalSection(&RPLIDARCS[id]);
		}
		if (bExitExpressScanRPLIDAR[id]) break;
	}

	return 0;
}